

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

void __thiscall inja::Renderer::pop_args(Renderer *this,Bytecode *bc)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ((*(uint *)&bc->field_0x4 & 0x3fffffff) - 1) +
          (uint)(*(uint *)&bc->field_0x4 < 0x40000000);
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::
    vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::pop_back(&this->m_stack);
  }
  return;
}

Assistant:

void pop_args(const Bytecode& bc) {
		unsigned int popArgs = bc.args;
		if ((bc.flags & Bytecode::Flag::ValueMask) != Bytecode::Flag::ValuePop) {
			popArgs -= 1;
		}
		for (unsigned int i = 0; i < popArgs; ++i) {
			m_stack.pop_back();
		}
	}